

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

void * lj_alloc_free(void *msp,void *ptr)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  char *__addr;
  uint uVar4;
  ulong *puVar5;
  uint uVar6;
  int iVar7;
  void *in_RAX;
  undefined4 extraout_var;
  ulong *puVar8;
  msegmentptr pmVar9;
  size_t sVar10;
  void *pvVar11;
  int *piVar12;
  long lVar13;
  ulong *puVar14;
  ulong *puVar15;
  long lVar16;
  ulong *addr;
  byte bVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong *puVar22;
  ulong uVar23;
  
  if (ptr == (void *)0x0) {
    return in_RAX;
  }
  addr = (ulong *)((long)ptr + -0x10);
  uVar18 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffffc;
  puVar8 = (ulong *)((long)ptr + uVar18);
  puVar14 = puVar8 + -2;
  uVar23 = uVar18;
  if ((*(ulong *)((long)ptr + -8) & 1) == 0) {
    uVar20 = *addr;
    if ((uVar20 & 1) != 0) {
      piVar12 = __errno_location();
      iVar2 = *piVar12;
      iVar7 = munmap((void *)((long)addr - (uVar20 & 0xfffffffffffffffe)),
                     uVar18 + (uVar20 & 0xfffffffffffffffe) + 0x20);
      *piVar12 = iVar2;
      return (void *)CONCAT44(extraout_var,iVar7);
    }
    addr = (ulong *)((long)addr - uVar20);
    uVar23 = uVar20 + uVar18;
    if (addr == *(ulong **)((long)msp + 0x18)) {
      uVar20 = puVar8[-1];
      if ((~(uint)uVar20 & 3) == 0) {
        *(ulong *)((long)msp + 8) = uVar23;
        puVar8[-1] = uVar20 & 0xfffffffffffffffe;
        addr[1] = uVar23 | 1;
        *puVar14 = uVar23;
        return puVar14;
      }
    }
    else {
      puVar15 = (ulong *)addr[3];
      if (uVar20 < 0x100) {
        puVar21 = (ulong *)addr[2];
        if (puVar21 == puVar15) {
          bVar17 = (byte)(uVar20 >> 3) & 0x1f;
          *(uint *)msp = *msp & (-2 << bVar17 | 0xfffffffeU >> 0x20 - bVar17);
        }
        else {
          puVar21[3] = (ulong)puVar15;
          puVar15[2] = (ulong)puVar21;
        }
      }
      else {
        uVar20 = addr[6];
        if (puVar15 == addr) {
          if ((ulong *)addr[5] == (ulong *)0x0) {
            if ((ulong *)addr[4] == (ulong *)0x0) {
              puVar15 = (ulong *)0x0;
              goto LAB_00139d35;
            }
            puVar21 = (ulong *)addr[4];
            puVar5 = addr + 4;
          }
          else {
            puVar21 = (ulong *)addr[5];
            puVar5 = addr + 5;
          }
          do {
            do {
              puVar22 = puVar5;
              puVar15 = puVar21;
              puVar21 = (ulong *)puVar15[5];
              puVar5 = puVar15 + 5;
            } while ((ulong *)puVar15[5] != (ulong *)0x0);
            puVar21 = (ulong *)puVar15[4];
            puVar5 = puVar15 + 4;
          } while ((ulong *)puVar15[4] != (ulong *)0x0);
          *puVar22 = 0;
        }
        else {
          uVar3 = addr[2];
          *(ulong **)(uVar3 + 0x18) = puVar15;
          puVar15[2] = uVar3;
        }
LAB_00139d35:
        if (uVar20 != 0) {
          uVar3 = addr[7];
          if (addr == *(ulong **)((long)msp + uVar3 * 8 + 0x248)) {
            *(ulong **)((long)msp + uVar3 * 8 + 0x248) = puVar15;
            if (puVar15 != (ulong *)0x0) goto LAB_00139d6a;
            bVar17 = (byte)uVar3 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar17 | 0xfffffffeU >> 0x20 - bVar17);
          }
          else {
            *(ulong **)(uVar20 + 0x20 + (ulong)(*(ulong **)(uVar20 + 0x20) != addr) * 8) = puVar15;
            if (puVar15 != (ulong *)0x0) {
LAB_00139d6a:
              puVar15[6] = uVar20;
              uVar20 = addr[4];
              if (uVar20 != 0) {
                puVar15[4] = uVar20;
                *(ulong **)(uVar20 + 0x30) = puVar15;
              }
              uVar20 = addr[5];
              if (uVar20 != 0) {
                puVar15[5] = uVar20;
                *(ulong **)(uVar20 + 0x30) = puVar15;
              }
            }
          }
        }
      }
    }
  }
  uVar18 = *(ulong *)((long)ptr + (uVar18 - 8));
  if ((uVar18 & 2) != 0) {
    puVar8[-1] = uVar18 & 0xfffffffffffffffe;
    addr[1] = uVar23 | 1;
    *(ulong *)((long)addr + uVar23) = uVar23;
    goto LAB_00139e06;
  }
  if (puVar14 == *(ulong **)((long)msp + 0x20)) {
    uVar23 = uVar23 + *(long *)((long)msp + 0x10);
    *(ulong *)((long)msp + 0x10) = uVar23;
    *(ulong **)((long)msp + 0x20) = addr;
    addr[1] = uVar23 | 1;
    if (addr == *(ulong **)((long)msp + 0x18)) {
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(undefined8 *)((long)msp + 8) = 0;
    }
    if (uVar23 <= *(ulong *)((long)msp + 0x28)) {
      return (void *)(uVar23 | 1);
    }
    if (0x40 < uVar23) {
      uVar18 = (uVar23 + 0x1ffbf & 0xfffffffffffe0000) - 0x20000;
      pmVar9 = segment_holding((mstate)msp,(char *)addr);
      uVar23 = pmVar9->size;
      if (uVar18 <= uVar23) {
        pcVar19 = (char *)((long)msp + 0x348);
        __addr = pmVar9->base;
        do {
          uVar20 = 0;
          if (__addr <= pcVar19 && pcVar19 < __addr + uVar23) goto LAB_00139ec6;
          pcVar19 = *(char **)(pcVar19 + 0x10);
        } while (pcVar19 != (char *)0x0);
        piVar12 = __errno_location();
        iVar2 = *piVar12;
        pvVar11 = mremap(__addr,uVar23,uVar23 - uVar18,0);
        *piVar12 = iVar2;
        if (pvVar11 == (void *)0xffffffffffffffff) {
          iVar7 = munmap(pmVar9->base + (uVar23 - uVar18),uVar18);
          *piVar12 = iVar2;
          uVar20 = 0;
          if ((uVar18 == 0) || (iVar7 != 0)) goto LAB_00139ec6;
        }
        else if (uVar18 == 0) goto LAB_00139ec3;
        pmVar9->size = pmVar9->size - uVar18;
        lVar16 = *(long *)((long)msp + 0x20);
        lVar13 = *(long *)((long)msp + 0x10) - uVar18;
        uVar23 = (ulong)(-(int)lVar16 - 0x10U & 7);
        uVar20 = lVar13 - uVar23;
        *(ulong *)((long)msp + 0x20) = lVar16 + uVar23;
        *(ulong *)((long)msp + 0x10) = uVar20;
        *(ulong *)(lVar16 + 8 + uVar23) = uVar20 | 1;
        *(undefined8 *)(lVar16 + 8 + lVar13) = 0x40;
        *(undefined8 *)((long)msp + 0x28) = 0x200000;
        uVar20 = uVar18;
        goto LAB_00139ec6;
      }
    }
LAB_00139ec3:
    uVar20 = 0;
LAB_00139ec6:
    sVar10 = release_unused_segments((mstate)msp);
    if ((void *)(sVar10 + uVar20) != (void *)0x0) {
      return (void *)(sVar10 + uVar20);
    }
    pvVar11 = *(void **)((long)msp + 0x10);
    if (pvVar11 <= *(void **)((long)msp + 0x28)) {
      return pvVar11;
    }
    *(undefined8 *)((long)msp + 0x28) = 0xffffffffffffffff;
    return pvVar11;
  }
  if (puVar14 == *(ulong **)((long)msp + 0x18)) {
    uVar23 = uVar23 + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar23;
    *(ulong **)((long)msp + 0x18) = addr;
    addr[1] = uVar23 | 1;
    *(ulong *)((long)addr + uVar23) = uVar23;
    return (void *)(uVar23 | 1);
  }
  uVar23 = uVar23 + (uVar18 & 0xfffffffffffffffc);
  puVar15 = (ulong *)puVar8[1];
  if (uVar18 < 0x100) {
    puVar8 = (ulong *)*puVar8;
    if (puVar8 == puVar15) {
      bVar17 = (byte)(uVar18 >> 3) & 0x1f;
      *(uint *)msp = *msp & (-2 << bVar17 | 0xfffffffeU >> 0x20 - bVar17);
    }
    else {
      puVar8[3] = (ulong)puVar15;
      puVar15[2] = (ulong)puVar8;
    }
  }
  else {
    uVar18 = puVar8[4];
    if (puVar15 == puVar14) {
      if ((ulong *)puVar8[3] == (ulong *)0x0) {
        if ((ulong *)puVar8[2] == (ulong *)0x0) {
          puVar15 = (ulong *)0x0;
          goto LAB_0013a106;
        }
        puVar21 = (ulong *)puVar8[2];
        puVar5 = puVar8 + 2;
      }
      else {
        puVar21 = (ulong *)puVar8[3];
        puVar5 = puVar8 + 3;
      }
      do {
        do {
          puVar22 = puVar5;
          puVar15 = puVar21;
          puVar21 = (ulong *)puVar15[5];
          puVar5 = puVar15 + 5;
        } while ((ulong *)puVar15[5] != (ulong *)0x0);
        puVar21 = (ulong *)puVar15[4];
        puVar5 = puVar15 + 4;
      } while ((ulong *)puVar15[4] != (ulong *)0x0);
      *puVar22 = 0;
    }
    else {
      uVar20 = *puVar8;
      *(ulong **)(uVar20 + 0x18) = puVar15;
      puVar15[2] = uVar20;
    }
LAB_0013a106:
    if (uVar18 != 0) {
      uVar20 = puVar8[5];
      if (puVar14 == *(ulong **)((long)msp + uVar20 * 8 + 0x248)) {
        *(ulong **)((long)msp + uVar20 * 8 + 0x248) = puVar15;
        if (puVar15 != (ulong *)0x0) goto LAB_0013a13b;
        bVar17 = (byte)uVar20 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar17 | 0xfffffffeU >> 0x20 - bVar17);
      }
      else {
        *(ulong **)(uVar18 + 0x20 + (ulong)(*(ulong **)(uVar18 + 0x20) != puVar14) * 8) = puVar15;
        if (puVar15 != (ulong *)0x0) {
LAB_0013a13b:
          puVar15[6] = uVar18;
          uVar18 = puVar8[2];
          if (uVar18 != 0) {
            puVar15[4] = uVar18;
            *(ulong **)(uVar18 + 0x30) = puVar15;
          }
          uVar18 = puVar8[3];
          if (uVar18 != 0) {
            puVar15[5] = uVar18;
            *(ulong **)(uVar18 + 0x30) = puVar15;
          }
        }
      }
    }
  }
  addr[1] = uVar23 | 1;
  *(ulong *)((long)addr + uVar23) = uVar23;
  if (addr == *(ulong **)((long)msp + 0x18)) {
    *(ulong *)((long)msp + 8) = uVar23;
    return (void *)(uVar23 | 1);
  }
LAB_00139e06:
  if (uVar23 < 0x100) {
    uVar23 = uVar23 >> 3;
    puVar8 = (ulong *)((long)msp + uVar23 * 0x10 + 0x38);
    if ((*msp >> ((uint)uVar23 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar23 & 0x1f);
      puVar14 = puVar8;
    }
    else {
      puVar14 = *(ulong **)((long)msp + uVar23 * 0x10 + 0x48);
    }
    *(ulong **)((long)msp + uVar23 * 0x10 + 0x48) = addr;
    puVar14[3] = (ulong)addr;
    addr[2] = (ulong)puVar14;
    addr[3] = (ulong)puVar8;
  }
  else {
    uVar6 = (uint)(uVar23 >> 8);
    if (uVar6 == 0) {
      uVar18 = 0;
    }
    else if (uVar6 < 0x10000) {
      uVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar18 = (ulong)((uVar23 >> ((ulong)(byte)(0x26 - (char)(uVar4 ^ 0x1f)) & 0x3f) & 1) != 0) |
               (ulong)((uVar4 ^ 0x1f) * 2 ^ 0x3e);
    }
    else {
      uVar18 = 0x1f;
    }
    puVar8 = (ulong *)((long)msp + uVar18 * 8 + 0x248);
    addr[7] = uVar18;
    addr[4] = 0;
    addr[5] = 0;
    if ((*(uint *)((long)msp + 4) >> ((uint)uVar18 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar18 & 0x1f);
      puVar14 = puVar8;
    }
    else {
      bVar17 = 0x39 - (char)(uVar18 >> 1);
      if (uVar18 == 0x1f) {
        bVar17 = 0;
      }
      lVar16 = uVar23 << (bVar17 & 0x3f);
      puVar8 = (ulong *)*puVar8;
      do {
        puVar15 = puVar8;
        if ((puVar15[1] & 0xfffffffffffffffc) == uVar23) {
          puVar8 = puVar15 + 2;
          puVar14 = (ulong *)puVar15[2];
          puVar14[3] = (ulong)addr;
          lVar16 = 0x30;
          lVar13 = 0x10;
          puVar21 = (ulong *)0x0;
          goto LAB_0013a010;
        }
        lVar13 = lVar16 >> 0x3f;
        lVar16 = lVar16 * 2;
        puVar8 = (ulong *)puVar15[4 - lVar13];
      } while ((ulong *)puVar15[4 - lVar13] != (ulong *)0x0);
      puVar8 = puVar15 + (4 - lVar13);
      puVar14 = puVar15;
    }
    lVar13 = 0x30;
    lVar16 = 0x10;
    puVar15 = addr;
    puVar21 = addr;
LAB_0013a010:
    *puVar8 = (ulong)addr;
    *(ulong **)((long)addr + lVar13) = puVar14;
    addr[3] = (ulong)puVar15;
    *(ulong **)((long)addr + lVar16) = puVar21;
    plVar1 = (long *)((long)msp + 0x30);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      pvVar11 = (void *)release_unused_segments((mstate)msp);
      return pvVar11;
    }
  }
  return puVar8;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_free(void *msp, void *ptr)
{
  if (ptr != 0) {
    mchunkptr p = mem2chunk(ptr);
    mstate fm = (mstate)msp;
    size_t psize = chunksize(p);
    mchunkptr next = chunk_plus_offset(p, psize);
    if (!pinuse(p)) {
      size_t prevsize = p->prev_foot;
      if ((prevsize & IS_DIRECT_BIT) != 0) {
	prevsize &= ~IS_DIRECT_BIT;
	psize += prevsize + DIRECT_FOOT_PAD;
	CALL_MUNMAP((char *)p - prevsize, psize);
	return NULL;
      } else {
	mchunkptr prev = chunk_minus_offset(p, prevsize);
	psize += prevsize;
	p = prev;
	/* consolidate backward */
	if (p != fm->dv) {
	  unlink_chunk(fm, p, prevsize);
	} else if ((next->head & INUSE_BITS) == INUSE_BITS) {
	  fm->dvsize = psize;
	  set_free_with_pinuse(p, psize, next);
	  return NULL;
	}
      }
    }
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == fm->top) {
	size_t tsize = fm->topsize += psize;
	fm->top = p;
	p->head = tsize | PINUSE_BIT;
	if (p == fm->dv) {
	  fm->dv = 0;
	  fm->dvsize = 0;
	}
	if (tsize > fm->trim_check)
	  alloc_trim(fm, 0);
	return NULL;
      } else if (next == fm->dv) {
	size_t dsize = fm->dvsize += psize;
	fm->dv = p;
	set_size_and_pinuse_of_free_chunk(p, dsize);
	return NULL;
      } else {
	size_t nsize = chunksize(next);
	psize += nsize;
	unlink_chunk(fm, next, nsize);
	set_size_and_pinuse_of_free_chunk(p, psize);
	if (p == fm->dv) {
	  fm->dvsize = psize;
	  return NULL;
	}
      }
    } else {
      set_free_with_pinuse(p, psize, next);
    }

    if (is_small(psize)) {
      insert_small_chunk(fm, p, psize);
    } else {
      tchunkptr tp = (tchunkptr)p;
      insert_large_chunk(fm, tp, psize);
      if (--fm->release_checks == 0)
	release_unused_segments(fm);
    }
  }
  return NULL;
}